

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void hts_idx_set_meta(hts_idx_t *idx,int l_meta,uint8_t *meta,int is_copy)

{
  uint8_t *__dest;
  
  if (idx->meta != (uint8_t *)0x0) {
    free(idx->meta);
  }
  idx->l_meta = l_meta;
  if (is_copy != 0) {
    __dest = (uint8_t *)malloc((long)l_meta);
    idx->meta = __dest;
    memcpy(__dest,meta,(long)l_meta);
    return;
  }
  idx->meta = meta;
  return;
}

Assistant:

void hts_idx_set_meta(hts_idx_t *idx, int l_meta, uint8_t *meta, int is_copy)
{
    if (idx->meta) free(idx->meta);
    idx->l_meta = l_meta;
    if (is_copy) {
        idx->meta = (uint8_t*)malloc(l_meta);
        memcpy(idx->meta, meta, l_meta);
    } else idx->meta = meta;
}